

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

char * old_create_transform_action_spec
                 (CMFormatList format_list,CMFormatList out_format_list,char *function)

{
  FMFieldList p_Var1;
  int iVar2;
  FMStructDescList format_list_00;
  CMFormatList pCVar3;
  FMStructDescList out_format_list_00;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  CMFormatList pCVar7;
  ulong uVar8;
  
  uVar6 = 0;
  for (pCVar7 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar7->format_name != (char *)0x0));
      pCVar7 = pCVar7 + 1) {
    uVar6 = uVar6 + 1;
  }
  uVar8 = (ulong)uVar6;
  pCVar7 = out_format_list;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar8 * 0x20 + 0x20);
  if (uVar6 != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&format_list_00->format_name + lVar5 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar5);
      p_Var1 = *(FMFieldList *)((long)&format_list->field_list + lVar5);
      *(FMFieldList *)((long)&format_list_00->field_list + lVar5 * 2) = p_Var1;
      iVar2 = struct_size_field_list(p_Var1,(int)pCVar7);
      *(int *)((long)&format_list_00->struct_size + lVar5 * 2) = iVar2;
      *(undefined8 *)((long)&format_list_00->opt_info + lVar5 * 2) = 0;
      lVar5 = lVar5 + 0x10;
    } while (uVar8 << 4 != lVar5);
  }
  format_list_00[uVar8].format_name = (char *)0x0;
  format_list_00[uVar8].field_list = (FMFieldList)0x0;
  uVar6 = 0;
  for (pCVar3 = out_format_list;
      (out_format_list != (CMFormatList)0x0 && (pCVar3->format_name != (char *)0x0));
      pCVar3 = pCVar3 + 1) {
    uVar6 = uVar6 + 1;
  }
  uVar8 = (ulong)uVar6;
  out_format_list_00 = (FMStructDescList)INT_CMmalloc(uVar8 * 0x20 + 0x20);
  if (uVar6 != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&out_format_list_00->format_name + lVar5 * 2) =
           *(undefined8 *)((long)&out_format_list->format_name + lVar5);
      p_Var1 = *(FMFieldList *)((long)&out_format_list->field_list + lVar5);
      *(FMFieldList *)((long)&out_format_list_00->field_list + lVar5 * 2) = p_Var1;
      iVar2 = struct_size_field_list(p_Var1,(int)pCVar7);
      *(int *)((long)&out_format_list_00->struct_size + lVar5 * 2) = iVar2;
      *(undefined8 *)((long)&out_format_list_00->opt_info + lVar5 * 2) = 0;
      lVar5 = lVar5 + 0x10;
    } while (uVar8 << 4 != lVar5);
  }
  out_format_list_00[uVar8].format_name = (char *)0x0;
  out_format_list_00[uVar8].field_list = (FMFieldList)0x0;
  pcVar4 = create_transform_action_spec(format_list_00,out_format_list_00,function);
  return pcVar4;
}

Assistant:

extern char *
old_create_transform_action_spec(CMFormatList format_list, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_transform_action_spec(structs, out_structs, function);
}